

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

deInt32 vkt::image::anon_unknown_2::getOperationInitialValue(AtomicOperation op)

{
  deInt32 local_c;
  AtomicOperation op_local;
  
  switch(op) {
  case ATOMIC_OPERATION_ADD:
    local_c = 0x12;
    break;
  case ATOMIC_OPERATION_MIN:
    local_c = 0x7fff;
    break;
  case ATOMIC_OPERATION_MAX:
    local_c = 0x12;
    break;
  case ATOMIC_OPERATION_AND:
    local_c = 0x7fff;
    break;
  case ATOMIC_OPERATION_OR:
    local_c = 0x12;
    break;
  case ATOMIC_OPERATION_XOR:
    local_c = 0x12;
    break;
  case ATOMIC_OPERATION_EXCHANGE:
    local_c = 0x12;
    break;
  default:
    local_c = -1;
  }
  return local_c;
}

Assistant:

static deInt32 getOperationInitialValue (const AtomicOperation op)
{
	switch (op)
	{
		// \note 18 is just an arbitrary small nonzero value.
		case ATOMIC_OPERATION_ADD:			return 18;
		case ATOMIC_OPERATION_MIN:			return (1 << 15) - 1;
		case ATOMIC_OPERATION_MAX:			return 18;
		case ATOMIC_OPERATION_AND:			return (1 << 15) - 1;
		case ATOMIC_OPERATION_OR:			return 18;
		case ATOMIC_OPERATION_XOR:			return 18;
		case ATOMIC_OPERATION_EXCHANGE:		return 18;
		default:
			DE_ASSERT(false);
			return -1;
	}
}